

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

ModuleDeclaration * __thiscall
soul::SourceCodeOperations::createDecl
          (ModuleDeclaration *__return_storage_ptr__,SourceCodeOperations *this,ModuleBase *m)

{
  bool condition;
  char *text;
  CodeLocation local_110;
  Comment local_100;
  CodeLocation local_c0;
  CodeLocation local_b0;
  char *local_a0;
  CodeLocation local_98;
  undefined1 local_88 [32];
  CodeLocation local_68;
  string local_58;
  undefined1 local_21;
  UTF8Reader local_20;
  ModuleBase *m_local;
  SourceCodeOperations *this_local;
  ModuleDeclaration *d;
  
  local_21 = 0;
  __return_storage_ptr__->module = m;
  __return_storage_ptr__->allocator = &this->allocator;
  (__return_storage_ptr__->startIncludingPreamble).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->startIncludingPreamble).location.data = (char *)0x0;
  local_20.data = (char *)m;
  m_local = (ModuleBase *)this;
  this_local = (SourceCodeOperations *)__return_storage_ptr__;
  CodeLocation::CodeLocation(&__return_storage_ptr__->startIncludingPreamble);
  (__return_storage_ptr__->moduleKeyword).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->moduleKeyword).location.data = (char *)0x0;
  CodeLocation::CodeLocation(&__return_storage_ptr__->moduleKeyword);
  (__return_storage_ptr__->openBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->openBrace).location.data = (char *)0x0;
  CodeLocation::CodeLocation(&__return_storage_ptr__->openBrace);
  (__return_storage_ptr__->endOfClosingBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->endOfClosingBrace).location.data = (char *)0x0;
  CodeLocation::CodeLocation(&__return_storage_ptr__->endOfClosingBrace);
  (__return_storage_ptr__->fileComment).valid = false;
  (__return_storage_ptr__->fileComment).isStarSlash = false;
  (__return_storage_ptr__->fileComment).isDoxygenStyle = false;
  (__return_storage_ptr__->fileComment).isReferringBackwards = false;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->fileComment).lines);
  (__return_storage_ptr__->fileComment).range.start.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.start.location.data = (char *)0x0;
  CodeLocation::CodeLocation(&(__return_storage_ptr__->fileComment).range.start);
  (__return_storage_ptr__->fileComment).range.end.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.end.location.data = (char *)0x0;
  CodeLocation::CodeLocation(&(__return_storage_ptr__->fileComment).range.end);
  CodeLocation::operator=
            (&__return_storage_ptr__->moduleKeyword,(CodeLocation *)(local_20.data + 0x30));
  ModuleDeclaration::getType_abi_cxx11_((string *)(local_88 + 0x30),__return_storage_ptr__);
  text = (char *)std::__cxx11::string::c_str();
  condition = UTF8Reader::startsWith(&(__return_storage_ptr__->moduleKeyword).location,text);
  checkAssertion(condition,"d.moduleKeyword.location.startsWith (d.getType().c_str())","createDecl",
                 0x72);
  std::__cxx11::string::~string((string *)(local_88 + 0x30));
  CodeLocation::CodeLocation
            ((CodeLocation *)(local_88 + 0x10),&__return_storage_ptr__->moduleKeyword);
  SourceCodeUtilities::findStartOfPrecedingComment
            ((SourceCodeUtilities *)(local_88 + 0x20),(CodeLocation *)(local_88 + 0x10));
  CodeLocation::operator=
            (&__return_storage_ptr__->startIncludingPreamble,(CodeLocation *)(local_88 + 0x20));
  CodeLocation::~CodeLocation((CodeLocation *)(local_88 + 0x20));
  CodeLocation::~CodeLocation((CodeLocation *)(local_88 + 0x10));
  CodeLocation::CodeLocation(&local_98,&__return_storage_ptr__->moduleKeyword);
  local_a0 = "{";
  SimpleTokeniser::findNext((SimpleTokeniser *)local_88,&local_98,(TokenType)"{");
  CodeLocation::operator=(&__return_storage_ptr__->openBrace,(CodeLocation *)local_88);
  CodeLocation::~CodeLocation((CodeLocation *)local_88);
  CodeLocation::~CodeLocation(&local_98);
  CodeLocation::CodeLocation(&local_c0,&__return_storage_ptr__->openBrace);
  SourceCodeUtilities::findEndOfMatchingBrace((SourceCodeUtilities *)&local_b0,&local_c0);
  CodeLocation::operator=(&__return_storage_ptr__->endOfClosingBrace,&local_b0);
  CodeLocation::~CodeLocation(&local_b0);
  CodeLocation::~CodeLocation(&local_c0);
  CodeLocation::CodeLocation(&local_110,&__return_storage_ptr__->startIncludingPreamble);
  SourceCodeUtilities::parseComment(&local_100,&local_110);
  SourceCodeUtilities::Comment::operator=(&__return_storage_ptr__->fileComment,&local_100);
  SourceCodeUtilities::Comment::~Comment(&local_100);
  CodeLocation::~CodeLocation(&local_110);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeOperations::ModuleDeclaration SourceCodeOperations::createDecl (AST::ModuleBase& m)
{
    ModuleDeclaration d { m, allocator };

    d.moduleKeyword = m.processorKeywordLocation;
    SOUL_ASSERT (d.moduleKeyword.location.startsWith (d.getType().c_str()));

    d.startIncludingPreamble = SourceCodeUtilities::findStartOfPrecedingComment (d.moduleKeyword);
    d.openBrace = SimpleTokeniser::findNext (d.moduleKeyword, Operator::openBrace);
    d.endOfClosingBrace = SourceCodeUtilities::findEndOfMatchingBrace (d.openBrace);
    d.fileComment = SourceCodeUtilities::parseComment (d.startIncludingPreamble);
    return d;
}